

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DODNTSCD.h
# Opt level: O2

void __thiscall
dg::DODNTSCD::
computeNTSCD<std::map<dg::CDNode*,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>>
          (DODNTSCD *this,CDNode *p,CDGraph *graph,
          map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
          *onallpaths,ResultT *CD,ResultT *revCD)

{
  _Rb_tree_header *p_Var1;
  pointer ppCVar2;
  _Base_ptr this_00;
  _Base_ptr this_01;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var8;
  pointer puVar9;
  ContainedType *n;
  CDNode *s2;
  CDNode *s1;
  _Head_base<0UL,_dg::CDNode_*,_false> local_60;
  ResultT *local_58;
  ResultT *local_50;
  CDNode *local_48;
  CDNode *local_40;
  CDNode *local_38;
  
  ppCVar2 = (p->super_ElemWithEdges<dg::CDNode>)._successors.
            super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = *ppCVar2;
  local_48 = ppCVar2[1];
  local_58 = CD;
  local_50 = revCD;
  local_40 = p;
  cVar6 = std::
          _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>,_std::_Select1st<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
          ::find(&onallpaths->_M_t,&local_38);
  p_Var1 = &(onallpaths->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
    cVar7 = std::
            _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>,_std::_Select1st<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
            ::find(&onallpaths->_M_t,&local_48);
    if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
      this_00 = cVar6._M_node[1]._M_parent;
      this_01 = cVar7._M_node[1]._M_parent;
      puVar3 = (graph->_nodes).
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar9 = (graph->_nodes).
                    super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1
          ) {
        local_60._M_head_impl =
             (puVar9->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t
             .super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
             super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
        bVar4 = ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                ::get((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                       *)this_00,(ulong)(local_60._M_head_impl)->_id);
        bVar5 = ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                ::get((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                       *)this_01,(ulong)(local_60._M_head_impl)->_id);
        if (bVar4 != bVar5) {
          p_Var8 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                    *)std::
                      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                      ::operator[](local_58,&local_60._M_head_impl);
          std::
          _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
          ::_M_insert_unique<dg::CDNode*const&>(p_Var8,&local_40);
          p_Var8 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                    *)std::
                      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                      ::operator[](local_50,&local_40);
          std::
          _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
          ::_M_insert_unique<dg::CDNode*const&>(p_Var8,&local_60._M_head_impl);
        }
      }
    }
  }
  return;
}

Assistant:

void computeNTSCD(CDNode *p, CDGraph &graph, const OnAllPathsT &onallpaths,
                      ResultT &CD, ResultT &revCD) {
        const auto &succs = p->successors();
        assert(succs.size() == 2);
        auto succit = succs.begin();
        auto *s1 = *succit;
        auto *s2 = *(++succit);
        assert(++succit == succs.end());

        auto it1 = onallpaths.find(s1);
        if (it1 == onallpaths.end())
            return;
        auto it2 = onallpaths.find(s2);
        if (it2 == onallpaths.end())
            return;

        const auto &nodes1 = it1->second;
        const auto &nodes2 = it2->second;
        // FIXME: we could do that faster
        for (auto *n : graph) {
            if (nodes1.get(n->getID()) ^ nodes2.get(n->getID())) {
                CD[n].insert(p);
                revCD[p].insert(n);
            }
        }
    }